

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O0

bool __thiscall
OpenMD::SwitchingFunction::getSwitch
          (SwitchingFunction *this,RealType *r2,RealType *sw,RealType *dswdr,RealType *r)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  double *in_RSI;
  long in_RDI;
  double *in_R8;
  double dVar1;
  bool in_switching_region;
  RealType *in_stack_00000048;
  RealType *in_stack_00000050;
  RealType *in_stack_00000058;
  CubicSpline *in_stack_00000060;
  undefined1 local_29;
  
  *in_RDX = 0x3ff0000000000000;
  *in_RCX = 0;
  local_29 = false;
  if (*(double *)(in_RDI + 0x10) <= *in_RSI && *in_RSI != *(double *)(in_RDI + 0x10)) {
    local_29 = *in_RSI < *(double *)(in_RDI + 0x18) || *in_RSI == *(double *)(in_RDI + 0x18);
    if (local_29) {
      dVar1 = sqrt(*in_RSI);
      *in_R8 = dVar1;
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2bd0d3);
      CubicSpline::getValueAndDerivativeAt
                (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
    }
    else {
      *in_RDX = 0;
    }
  }
  return local_29;
}

Assistant:

bool SwitchingFunction::getSwitch(const RealType& r2, RealType& sw,
                                    RealType& dswdr, RealType& r) {
    sw    = 1.0;
    dswdr = 0.0;

    bool in_switching_region = false;

    if (r2 > rin2_) {
      if (r2 > rout2_) {
        sw = 0.0;
      } else {
        in_switching_region = true;
        r                   = sqrt(r2);
        switchSpline_->getValueAndDerivativeAt(r, sw, dswdr);
      }
    }
    return in_switching_region;
  }